

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_privkey_tweak_add(secp256k1_context *ctx,uchar *seckey,uchar *tweak)

{
  int iVar1;
  bool local_71;
  int local_70;
  uint local_6c;
  int overflow;
  int ret;
  secp256k1_scalar sec;
  secp256k1_scalar term;
  uchar *tweak_local;
  uchar *seckey_local;
  secp256k1_context *ctx_local;
  
  local_6c = 0;
  local_70 = 0;
  if (seckey == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"seckey != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (tweak == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"tweak != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_set_b32((secp256k1_scalar *)(sec.d + 6),tweak,&local_70);
    secp256k1_scalar_set_b32((secp256k1_scalar *)&overflow,seckey,(int *)0x0);
    local_71 = false;
    if (local_70 == 0) {
      iVar1 = secp256k1_eckey_privkey_tweak_add
                        ((secp256k1_scalar *)&overflow,(secp256k1_scalar *)(sec.d + 6));
      local_71 = iVar1 != 0;
    }
    local_6c = (uint)local_71;
    memset(seckey,0,0x20);
    if (local_6c != 0) {
      secp256k1_scalar_get_b32(seckey,(secp256k1_scalar *)&overflow);
    }
    secp256k1_scalar_clear((secp256k1_scalar *)&overflow);
    secp256k1_scalar_clear((secp256k1_scalar *)(sec.d + 6));
    ctx_local._4_4_ = local_6c;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_privkey_tweak_add(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak) {
    secp256k1_scalar term;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&term, tweak, &overflow);
    secp256k1_scalar_set_b32(&sec, seckey, NULL);

    ret = !overflow && secp256k1_eckey_privkey_tweak_add(&sec, &term);
    memset(seckey, 0, 32);
    if (ret) {
        secp256k1_scalar_get_b32(seckey, &sec);
    }

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&term);
    return ret;
}